

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t checksum(archive_read *a,void *h)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  char *p;
  
  p = (char *)((long)&a->read_data_block + 4);
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 8) {
      iVar2 = tar_atol(p,8);
      iVar3 = 0;
      for (lVar1 = 0; lVar1 != 0x94; lVar1 = lVar1 + 1) {
        iVar3 = iVar3 + (uint)*(byte *)((long)&(a->archive).magic + lVar1);
      }
      iVar3 = iVar3 + 0x100;
      for (lVar1 = 0x9c; lVar1 != 0x200; lVar1 = lVar1 + 1) {
        iVar3 = iVar3 + (uint)*(byte *)((long)&(a->archive).magic + lVar1);
      }
      if (iVar3 == (int)iVar2) {
        wVar4 = L'\x01';
      }
      else {
        iVar3 = 0;
        for (lVar1 = 0; lVar1 != 0x94; lVar1 = lVar1 + 1) {
          iVar3 = iVar3 + *(char *)((long)&(a->archive).magic + lVar1);
        }
        iVar3 = iVar3 + 0x100;
        for (lVar1 = 0x9c; lVar1 != 0x200; lVar1 = lVar1 + 1) {
          iVar3 = iVar3 + *(char *)((long)&(a->archive).magic + lVar1);
        }
        wVar4 = (wchar_t)(iVar3 == (int)iVar2);
      }
      return wVar4;
    }
    uVar5 = (ulong)(byte)p[lVar1];
    if ((0x37 < uVar5) || ((0xff000100000001U >> (uVar5 & 0x3f) & 1) == 0)) break;
    lVar1 = lVar1 + 1;
  }
  return L'\0';
}

Assistant:

static int
checksum(struct archive_read *a, const void *h)
{
	const unsigned char *bytes;
	const struct archive_entry_header_ustar	*header;
	int check, sum;
	size_t i;

	(void)a; /* UNUSED */
	bytes = (const unsigned char *)h;
	header = (const struct archive_entry_header_ustar *)h;

	/* Checksum field must hold an octal number */
	for (i = 0; i < sizeof(header->checksum); ++i) {
		char c = header->checksum[i];
		if (c != ' ' && c != '\0' && (c < '0' || c > '7'))
			return 0;
	}

	/*
	 * Test the checksum.  Note that POSIX specifies _unsigned_
	 * bytes for this calculation.
	 */
	sum = (int)tar_atol(header->checksum, sizeof(header->checksum));
	check = 0;
	for (i = 0; i < 148; i++)
		check += (unsigned char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (unsigned char)bytes[i];
	if (sum == check)
		return (1);

	/*
	 * Repeat test with _signed_ bytes, just in case this archive
	 * was created by an old BSD, Solaris, or HP-UX tar with a
	 * broken checksum calculation.
	 */
	check = 0;
	for (i = 0; i < 148; i++)
		check += (signed char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (signed char)bytes[i];
	if (sum == check)
		return (1);

	return (0);
}